

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O3

void __thiscall
Assimp::FBX::FBXConverter::GenerateNodeAnimations
          (FBXConverter *this,vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> *node_anims,
          string *fixed_name,
          vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
          *curves,LayerMap *layer_map,int64_t start,int64_t stop,double *max_time,double *min_time)

{
  pointer ppAVar1;
  iterator __position;
  bool bVar2;
  AnimationCurveMap *pAVar3;
  vector<Assimp::FBX::AnimationCurveNode_const*,std::allocator<Assimp::FBX::AnimationCurveNode_const*>>
  *this_00;
  FBXConverter *target;
  char *pcVar4;
  iterator curves_00;
  mapped_type *pmVar5;
  aiNodeAnim *paVar6;
  Model *extraout_RDX;
  Model *extraout_RDX_00;
  Model *extraout_RDX_01;
  uint uVar7;
  pointer ppAVar8;
  iterator iVar9;
  FBXConverter *this_01;
  TransformationComp TVar10;
  _Base_ptr p_Var11;
  Object *pOVar12;
  Object *pOVar13;
  uint uVar14;
  ulong uVar15;
  AnimationCurveNode *pAVar16;
  AnimationCurveNode *this_02;
  long lVar17;
  bool bVar18;
  aiNodeAnim *na;
  vector<aiNodeAnim*,std::allocator<aiNodeAnim*>> *local_2b0;
  AnimationCurveNode *node;
  undefined1 local_298 [24];
  aiNodeAnim *inv;
  undefined8 local_278;
  undefined8 local_270;
  NodeMap node_property_map;
  const_iterator chain [17];
  aiNodeAnim *nd;
  
  node_property_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &node_property_map._M_t._M_impl.super__Rb_tree_header._M_header;
  node_property_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  node_property_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  node_property_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  ppAVar8 = (curves->
            super__Vector_base<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  ppAVar1 = (curves->
            super__Vector_base<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  local_2b0 = (vector<aiNodeAnim*,std::allocator<aiNodeAnim*>> *)node_anims;
  node_property_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       node_property_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (ppAVar1 == ppAVar8) {
    __assert_fail("curves.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                  ,0xa92,
                  "void Assimp::FBX::FBXConverter::GenerateNodeAnimations(std::vector<aiNodeAnim *> &, const std::string &, const std::vector<const AnimationCurveNode *> &, const LayerMap &, int64_t, int64_t, double &, double &)"
                 );
  }
  bVar2 = this->doc->settings->strictMode;
  pOVar12 = (Object *)0x0;
  do {
    pAVar16 = *ppAVar8;
    pOVar13 = pAVar16->target;
    if ((pOVar12 != (Object *)0x0) && (bVar18 = pOVar13 != pOVar12, pOVar13 = pOVar12, bVar18)) {
      LogFunctions<Assimp::FBXImporter>::LogWarn((char *)0x178a65);
    }
    if ((bVar2 != false) && (pAVar16->target != pOVar13)) {
      __assert_fail("node->Target() == target",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                    ,0xa81,
                    "void Assimp::FBX::validateAnimCurveNodes(const std::vector<const AnimationCurveNode *> &, bool)"
                   );
    }
    ppAVar8 = ppAVar8 + 1;
    pOVar12 = pOVar13;
  } while (ppAVar8 != ppAVar1);
  ppAVar8 = (curves->
            super__Vector_base<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  ppAVar1 = (curves->
            super__Vector_base<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (ppAVar8 != ppAVar1) {
    pAVar16 = (AnimationCurveNode *)0x0;
    do {
      this_02 = *ppAVar8;
      node = this_02;
      if (this_02 == (AnimationCurveNode *)0x0) {
        __assert_fail("node",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                      ,0xa99,
                      "void Assimp::FBX::FBXConverter::GenerateNodeAnimations(std::vector<aiNodeAnim *> &, const std::string &, const std::vector<const AnimationCurveNode *> &, const LayerMap &, int64_t, int64_t, double &, double &)"
                     );
      }
      if ((this_02->prop)._M_string_length == 0) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)chain,
                       "target property for animation curve not set: ",&(this_02->super_Object).name
                      );
        Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
        basic_formatter<std::__cxx11::string>
                  ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)&nd,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)chain);
        LogFunctions<Assimp::FBXImporter>::LogWarn((format *)&nd);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&nd);
        std::ios_base::~ios_base((ios_base *)&stack0xfffffffffffffec8);
        this_02 = pAVar16;
        if (chain[0]._M_node != (_Base_ptr)(chain + 2)) {
          operator_delete(chain[0]._M_node);
        }
      }
      else {
        pAVar3 = AnimationCurveNode::Curves_abi_cxx11_(this_02);
        if ((pAVar3->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)chain,
                         "no animation curves assigned to AnimationCurveNode: ",
                         &(node->super_Object).name);
          Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
          basic_formatter<std::__cxx11::string>
                    ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)&nd,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)chain);
          LogFunctions<Assimp::FBXImporter>::LogWarn((format *)&nd);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&nd);
          std::ios_base::~ios_base((ios_base *)&stack0xfffffffffffffec8);
          if (chain[0]._M_node != (_Base_ptr)(chain + 2)) {
            operator_delete(chain[0]._M_node);
          }
        }
        else {
          this_00 = (vector<Assimp::FBX::AnimationCurveNode_const*,std::allocator<Assimp::FBX::AnimationCurveNode_const*>>
                     *)std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>_>
                       ::operator[](&node_property_map,&node->prop);
          __position._M_current = *(AnimationCurveNode ***)(this_00 + 8);
          if (__position._M_current == *(AnimationCurveNode ***)(this_00 + 0x10)) {
            std::
            vector<Assimp::FBX::AnimationCurveNode_const*,std::allocator<Assimp::FBX::AnimationCurveNode_const*>>
            ::_M_realloc_insert<Assimp::FBX::AnimationCurveNode_const*const&>
                      (this_00,__position,&node);
          }
          else {
            *__position._M_current = node;
            *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
          }
        }
      }
      ppAVar8 = ppAVar8 + 1;
      pAVar16 = this_02;
    } while (ppAVar8 != ppAVar1);
    if (this_02 != (AnimationCurveNode *)0x0) {
      if ((this_02->target == (Object *)0x0) ||
         (target = (FBXConverter *)
                   __dynamic_cast(this_02->target,&Object::typeinfo,&Model::typeinfo,0),
         target == (FBXConverter *)0x0)) {
        __assert_fail("curve_node->TargetAsModel()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                      ,0xaaa,
                      "void Assimp::FBX::FBXConverter::GenerateNodeAnimations(std::vector<aiNodeAnim *> &, const std::string &, const std::vector<const AnimationCurveNode *> &, const LayerMap &, int64_t, int64_t, double &, double &)"
                     );
      }
      paVar6 = (aiNodeAnim *)chain;
      uVar15 = 0;
      iVar9._M_current = (aiNodeAnim **)0x0;
      memset(paVar6,0,0x88);
      local_270 = &(target->meshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                   super__Vector_impl_data._M_finish;
      lVar17 = 0;
      local_298._16_8_ = (pointer)0x0;
LAB_00178c68:
      lVar17 = lVar17 + 1;
      local_278 = uVar15;
      do {
        TVar10 = (int)lVar17 - TransformationComp_GeometricRotationInverse;
        if ((TVar10 & (TransformationComp_GeometricScaling|TransformationComp_ScalingPivot)) ==
            TransformationComp_RotationPivotInverse) {
          chain[lVar17 + -1]._M_node =
               &node_property_map._M_t._M_impl.super__Rb_tree_header._M_header;
        }
        else {
          pcVar4 = NameTransformationCompProperty((FBXConverter *)paVar6,TVar10);
          std::__cxx11::string::string((string *)&nd,pcVar4,(allocator *)&node);
          iVar9._M_current = &nd;
          curves_00 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>_>
                      ::find(&node_property_map._M_t,(key_type *)&nd);
          chain[lVar17 + -1]._M_node = curves_00._M_node;
          paVar6 = nd;
          if (nd != (aiNodeAnim *)&stack0xfffffffffffffe68) {
            operator_delete(nd);
          }
          if ((_Rb_tree_header *)curves_00._M_node !=
              &node_property_map._M_t._M_impl.super__Rb_tree_header) {
            if (this->doc->settings->optimizeEmptyAnimationCurves != true) goto LAB_00178d84;
            curves_00._M_node = curves_00._M_node + 2;
            iVar9._M_current = (aiNodeAnim **)target;
            bVar2 = IsRedundantAnimationData
                              ((FBXConverter *)paVar6,(Model *)target,TVar10,
                               (vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
                                *)curves_00._M_node);
            if (!bVar2) goto LAB_00178d84;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &node,"dropping redundant animation channel for node ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_270);
            Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
            basic_formatter<std::__cxx11::string>
                      ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)&nd,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&node);
            LogFunctions<Assimp::FBXImporter>::LogDebug((format *)&nd);
            iVar9._M_current = (aiNodeAnim **)&std::__cxx11::ostringstream::VTT;
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&nd);
            std::ios_base::~ios_base((ios_base *)&stack0xfffffffffffffec8);
            paVar6 = (aiNodeAnim *)node;
            if (node != (AnimationCurveNode *)local_298) {
              operator_delete(node);
            }
          }
        }
        lVar17 = lVar17 + 1;
        if (lVar17 == 0x12) {
          if ((local_278 & 1) != 0) goto LAB_00178db9;
          LogFunctions<Assimp::FBXImporter>::LogWarn((char *)0x17909e);
          goto LAB_001790b8;
        }
      } while( true );
    }
  }
  __assert_fail("curve_node",
                "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                ,0xaa9,
                "void Assimp::FBX::FBXConverter::GenerateNodeAnimations(std::vector<aiNodeAnim *> &, const std::string &, const std::vector<const AnimationCurveNode *> &, const LayerMap &, int64_t, int64_t, double &, double &)"
               );
LAB_00178d84:
  local_298._16_8_ =
       CONCAT71(SUB87(local_298._16_8_,1),
                (byte)local_298._16_8_ |
                ((TVar10 & (TransformationComp_GeometricScaling|TransformationComp_ScalingPivot)) !=
                 TransformationComp_Translation && lVar17 != 0xd));
  uVar15 = CONCAT71((int7)((ulong)curves_00._M_node >> 8),1);
  if (lVar17 == 0x11) goto LAB_00178db9;
  goto LAB_00178c68;
LAB_00178db9:
  if (((local_298._16_8_ & 1) != 0) ||
     (iVar9._M_current = (aiNodeAnim **)target,
     bVar2 = NeedsComplexTransformationChain((FBXConverter *)paVar6,(Model *)target), bVar2)) {
    lVar17 = 0;
    uVar14 = 1;
    uVar7 = 0;
    do {
      p_Var11 = chain[lVar17]._M_node;
      if ((_Rb_tree_header *)p_Var11 != &node_property_map._M_t._M_impl.super__Rb_tree_header) {
        if (lVar17 == 0xd) {
          __assert_fail("comp != TransformationComp_ScalingPivotInverse",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                        ,0xafd,
                        "void Assimp::FBX::FBXConverter::GenerateNodeAnimations(std::vector<aiNodeAnim *> &, const std::string &, const std::vector<const AnimationCurveNode *> &, const LayerMap &, int64_t, int64_t, double &, double &)"
                       );
        }
        if (lVar17 == 9) {
          __assert_fail("comp != TransformationComp_RotationPivotInverse",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                        ,0xafc,
                        "void Assimp::FBX::FBXConverter::GenerateNodeAnimations(std::vector<aiNodeAnim *> &, const std::string &, const std::vector<const AnimationCurveNode *> &, const LayerMap &, int64_t, int64_t, double &, double &)"
                       );
        }
        TVar10 = (TransformationComp)lVar17;
        NameTransformationChainNode
                  ((string *)&nd,(FBXConverter *)iVar9._M_current,fixed_name,TVar10);
        na = (aiNodeAnim *)0x0;
        if (TransformationComp_GeometricScaling < TVar10) {
LAB_00179304:
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                        ,0xb61,
                        "void Assimp::FBX::FBXConverter::GenerateNodeAnimations(std::vector<aiNodeAnim *> &, const std::string &, const std::vector<const AnimationCurveNode *> &, const LayerMap &, int64_t, int64_t, double &, double &)"
                       );
        }
        uVar7 = uVar7 | uVar14;
        if ((0x4c38U >>
             (TVar10 & (TransformationComp_GeometricScaling|TransformationComp_GeometricRotation)) &
            1) == 0) {
          iVar9._M_current = &nd;
          if ((0x81c0U >>
               (TVar10 & (TransformationComp_GeometricScaling|TransformationComp_GeometricRotation))
              & 1) == 0) {
            if ((0x11000U >>
                 (TVar10 & (TransformationComp_GeometricScaling|TransformationComp_GeometricRotation
                           )) & 1) == 0) goto LAB_00179304;
            na = GenerateScalingNodeAnim
                           (this,(string *)&nd,extraout_RDX,
                            (vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
                             *)(p_Var11 + 2),layer_map,start,stop,max_time,min_time);
          }
          else {
            na = GenerateRotationNodeAnim
                           (this,(string *)&nd,(Model *)target,
                            (vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
                             *)(p_Var11 + 2),layer_map,start,stop,max_time,min_time);
          }
        }
        else {
          p_Var11 = p_Var11 + 2;
          this_01 = (FBXConverter *)&nd;
          na = GenerateTranslationNodeAnim
                         (this,(string *)&nd,extraout_RDX,
                          (vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
                           *)p_Var11,layer_map,start,stop,max_time,min_time,false);
          if (lVar17 == 5) {
            iVar9._M_current = (aiNodeAnim **)&node;
            NameTransformationChainNode
                      ((string *)iVar9._M_current,this_01,fixed_name,
                       TransformationComp_RotationPivotInverse);
            paVar6 = GenerateTranslationNodeAnim
                               (this,(string *)iVar9._M_current,extraout_RDX_00,
                                (vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
                                 *)p_Var11,layer_map,start,stop,max_time,min_time,true);
            inv = paVar6;
            if (((paVar6->mNumPositionKeys == 0) && (paVar6->mNumRotationKeys == 0)) &&
               (paVar6->mNumScalingKeys == 0)) {
              aiNodeAnim::~aiNodeAnim(paVar6);
              operator_delete(paVar6);
            }
            else {
              iVar9._M_current = *(aiNodeAnim ***)(local_2b0 + 8);
              if (iVar9._M_current == *(aiNodeAnim ***)(local_2b0 + 0x10)) {
                std::vector<aiNodeAnim*,std::allocator<aiNodeAnim*>>::
                _M_realloc_insert<aiNodeAnim*const&>(local_2b0,iVar9,&inv);
              }
              else {
                *iVar9._M_current = paVar6;
                *(long *)(local_2b0 + 8) = *(long *)(local_2b0 + 8) + 8;
              }
            }
            if (node != (AnimationCurveNode *)local_298) {
              operator_delete(node);
            }
            if (na == (aiNodeAnim *)0x0) {
              __assert_fail("na",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                            ,0xb64,
                            "void Assimp::FBX::FBXConverter::GenerateNodeAnimations(std::vector<aiNodeAnim *> &, const std::string &, const std::vector<const AnimationCurveNode *> &, const LayerMap &, int64_t, int64_t, double &, double &)"
                           );
            }
            uVar7 = uVar7 | uVar14 << 4;
          }
          else {
            iVar9._M_current = (aiNodeAnim **)this_01;
            if (lVar17 == 0xb) {
              NameTransformationChainNode
                        ((string *)&node,this_01,fixed_name,TransformationComp_ScalingPivotInverse);
              paVar6 = GenerateTranslationNodeAnim
                                 (this,(string *)&node,extraout_RDX_01,
                                  (vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
                                   *)p_Var11,layer_map,start,stop,max_time,min_time,true);
              inv = paVar6;
              if (((paVar6->mNumPositionKeys == 0) && (paVar6->mNumRotationKeys == 0)) &&
                 (paVar6->mNumScalingKeys == 0)) {
                aiNodeAnim::~aiNodeAnim(paVar6);
                operator_delete(paVar6);
              }
              else {
                std::vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>::push_back
                          ((vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> *)local_2b0,&inv);
              }
              __assert_fail("TransformationComp_RotationPivotInverse > i",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                            ,0xb4e,
                            "void Assimp::FBX::FBXConverter::GenerateNodeAnimations(std::vector<aiNodeAnim *> &, const std::string &, const std::vector<const AnimationCurveNode *> &, const LayerMap &, int64_t, int64_t, double &, double &)"
                           );
            }
          }
        }
        paVar6 = na;
        if (((na->mNumPositionKeys == 0) && (na->mNumRotationKeys == 0)) &&
           (na->mNumScalingKeys == 0)) {
          aiNodeAnim::~aiNodeAnim(na);
          operator_delete(paVar6);
        }
        else {
          iVar9._M_current = *(aiNodeAnim ***)(local_2b0 + 8);
          if (iVar9._M_current == *(aiNodeAnim ***)(local_2b0 + 0x10)) {
            std::vector<aiNodeAnim*,std::allocator<aiNodeAnim*>>::
            _M_realloc_insert<aiNodeAnim*const&>(local_2b0,iVar9,&na);
          }
          else {
            *iVar9._M_current = na;
            *(long *)(local_2b0 + 8) = *(long *)(local_2b0 + 8) + 8;
          }
        }
        if (nd != (aiNodeAnim *)&stack0xfffffffffffffe68) {
          operator_delete(nd);
        }
      }
      lVar17 = lVar17 + 1;
      uVar14 = uVar14 * 2;
    } while (lVar17 != 0x11);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             ::operator[](&this->node_anim_chain_bits,fixed_name);
    *pmVar5 = uVar7;
  }
  else {
    paVar6 = GenerateSimpleNodeAnim
                       (this,fixed_name,(Model *)target,chain,
                        (const_iterator)&node_property_map._M_t._M_impl.super__Rb_tree_header,
                        layer_map,start,stop,max_time,min_time,true);
    nd = paVar6;
    if ((paVar6->mNumPositionKeys == 0) &&
       ((paVar6->mNumRotationKeys == 0 && (paVar6->mNumScalingKeys == 0)))) {
      aiNodeAnim::~aiNodeAnim(paVar6);
      operator_delete(paVar6);
    }
    else {
      iVar9._M_current = *(aiNodeAnim ***)(local_2b0 + 8);
      if (iVar9._M_current == *(aiNodeAnim ***)(local_2b0 + 0x10)) {
        std::vector<aiNodeAnim*,std::allocator<aiNodeAnim*>>::_M_realloc_insert<aiNodeAnim*const&>
                  (local_2b0,iVar9,&nd);
      }
      else {
        *iVar9._M_current = paVar6;
        *(long *)(local_2b0 + 8) = *(long *)(local_2b0 + 8) + 8;
      }
    }
  }
LAB_001790b8:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>_>
  ::~_Rb_tree(&node_property_map._M_t);
  return;
}

Assistant:

void FBXConverter::GenerateNodeAnimations(std::vector<aiNodeAnim*>& node_anims,
            const std::string& fixed_name,
            const std::vector<const AnimationCurveNode*>& curves,
            const LayerMap& layer_map,
            int64_t start, int64_t stop,
            double& max_time,
            double& min_time)
        {

            NodeMap node_property_map;
            ai_assert(curves.size());

#ifdef ASSIMP_BUILD_DEBUG
            validateAnimCurveNodes(curves, doc.Settings().strictMode);
#endif
            const AnimationCurveNode* curve_node = NULL;
            for (const AnimationCurveNode* node : curves) {
                ai_assert(node);

                if (node->TargetProperty().empty()) {
                    FBXImporter::LogWarn("target property for animation curve not set: " + node->Name());
                    continue;
                }

                curve_node = node;
                if (node->Curves().empty()) {
                    FBXImporter::LogWarn("no animation curves assigned to AnimationCurveNode: " + node->Name());
                    continue;
                }

                node_property_map[node->TargetProperty()].push_back(node);
            }

            ai_assert(curve_node);
            ai_assert(curve_node->TargetAsModel());

            const Model& target = *curve_node->TargetAsModel();

            // check for all possible transformation components
            NodeMap::const_iterator chain[TransformationComp_MAXIMUM];

            bool has_any = false;
            bool has_complex = false;

            for (size_t i = 0; i < TransformationComp_MAXIMUM; ++i) {
                const TransformationComp comp = static_cast<TransformationComp>(i);

                // inverse pivots don't exist in the input, we just generate them
                if (comp == TransformationComp_RotationPivotInverse || comp == TransformationComp_ScalingPivotInverse) {
                    chain[i] = node_property_map.end();
                    continue;
                }

                chain[i] = node_property_map.find(NameTransformationCompProperty(comp));
                if (chain[i] != node_property_map.end()) {

                    // check if this curves contains redundant information by looking
                    // up the corresponding node's transformation chain.
                    if (doc.Settings().optimizeEmptyAnimationCurves &&
                        IsRedundantAnimationData(target, comp, (*chain[i]).second)) {

                        FBXImporter::LogDebug("dropping redundant animation channel for node " + target.Name());
                        continue;
                    }

                    has_any = true;

                    if (comp != TransformationComp_Rotation && comp != TransformationComp_Scaling && comp != TransformationComp_Translation)
                    {
                        has_complex = true;
                    }
                }
            }

            if (!has_any) {
                FBXImporter::LogWarn("ignoring node animation, did not find any transformation key frames");
                return;
            }

            // this needs to play nicely with GenerateTransformationNodeChain() which will
            // be invoked _later_ (animations come first). If this node has only rotation,
            // scaling and translation _and_ there are no animated other components either,
            // we can use a single node and also a single node animation channel.
            if (!has_complex && !NeedsComplexTransformationChain(target)) {

                aiNodeAnim* const nd = GenerateSimpleNodeAnim(fixed_name, target, chain,
                    node_property_map.end(),
                    layer_map,
                    start, stop,
                    max_time,
                    min_time,
                    true // input is TRS order, assimp is SRT
                );

                ai_assert(nd);
                if (nd->mNumPositionKeys == 0 && nd->mNumRotationKeys == 0 && nd->mNumScalingKeys == 0) {
                    delete nd;
                }
                else {
                    node_anims.push_back(nd);
                }
                return;
            }

            // otherwise, things get gruesome and we need separate animation channels
            // for each part of the transformation chain. Remember which channels
            // we generated and pass this information to the node conversion
            // code to avoid nodes that have identity transform, but non-identity
            // animations, being dropped.
            unsigned int flags = 0, bit = 0x1;
            for (size_t i = 0; i < TransformationComp_MAXIMUM; ++i, bit <<= 1) {
                const TransformationComp comp = static_cast<TransformationComp>(i);

                if (chain[i] != node_property_map.end()) {
                    flags |= bit;

                    ai_assert(comp != TransformationComp_RotationPivotInverse);
                    ai_assert(comp != TransformationComp_ScalingPivotInverse);

                    const std::string& chain_name = NameTransformationChainNode(fixed_name, comp);

                    aiNodeAnim* na = nullptr;
                    switch (comp)
                    {
                    case TransformationComp_Rotation:
                    case TransformationComp_PreRotation:
                    case TransformationComp_PostRotation:
                    case TransformationComp_GeometricRotation:
                        na = GenerateRotationNodeAnim(chain_name,
                            target,
                            (*chain[i]).second,
                            layer_map,
                            start, stop,
                            max_time,
                            min_time);

                        break;

                    case TransformationComp_RotationOffset:
                    case TransformationComp_RotationPivot:
                    case TransformationComp_ScalingOffset:
                    case TransformationComp_ScalingPivot:
                    case TransformationComp_Translation:
                    case TransformationComp_GeometricTranslation:
                        na = GenerateTranslationNodeAnim(chain_name,
                            target,
                            (*chain[i]).second,
                            layer_map,
                            start, stop,
                            max_time,
                            min_time);

                        // pivoting requires us to generate an implicit inverse channel to undo the pivot translation
                        if (comp == TransformationComp_RotationPivot) {
                            const std::string& invName = NameTransformationChainNode(fixed_name,
                                TransformationComp_RotationPivotInverse);

                            aiNodeAnim* const inv = GenerateTranslationNodeAnim(invName,
                                target,
                                (*chain[i]).second,
                                layer_map,
                                start, stop,
                                max_time,
                                min_time,
                                true);

                            ai_assert(inv);
                            if (inv->mNumPositionKeys == 0 && inv->mNumRotationKeys == 0 && inv->mNumScalingKeys == 0) {
                                delete inv;
                            }
                            else {
                                node_anims.push_back(inv);
                            }

                            ai_assert(TransformationComp_RotationPivotInverse > i);
                            flags |= bit << (TransformationComp_RotationPivotInverse - i);
                        }
                        else if (comp == TransformationComp_ScalingPivot) {
                            const std::string& invName = NameTransformationChainNode(fixed_name,
                                TransformationComp_ScalingPivotInverse);

                            aiNodeAnim* const inv = GenerateTranslationNodeAnim(invName,
                                target,
                                (*chain[i]).second,
                                layer_map,
                                start, stop,
                                max_time,
                                min_time,
                                true);

                            ai_assert(inv);
                            if (inv->mNumPositionKeys == 0 && inv->mNumRotationKeys == 0 && inv->mNumScalingKeys == 0) {
                                delete inv;
                            }
                            else {
                                node_anims.push_back(inv);
                            }

                            ai_assert(TransformationComp_RotationPivotInverse > i);
                            flags |= bit << (TransformationComp_RotationPivotInverse - i);
                        }

                        break;

                    case TransformationComp_Scaling:
                    case TransformationComp_GeometricScaling:
                        na = GenerateScalingNodeAnim(chain_name,
                            target,
                            (*chain[i]).second,
                            layer_map,
                            start, stop,
                            max_time,
                            min_time);

                        break;

                    default:
                        ai_assert(false);
                    }

                    ai_assert(na);
                    if (na->mNumPositionKeys == 0 && na->mNumRotationKeys == 0 && na->mNumScalingKeys == 0) {
                        delete na;
                    }
                    else {
                        node_anims.push_back(na);
                    }
                    continue;
                }
            }

            node_anim_chain_bits[fixed_name] = flags;
        }